

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsort_wrapper.hpp
# Opt level: O0

bool dss::check<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long>
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      end,vector<unsigned_long,_std::allocator<unsigned_long>_> *SA)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  reference pcVar4;
  const_reference pvVar5;
  size_t n;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *SA_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin_local;
  
  end_local = begin;
  sVar2 = std::distance<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(begin,end);
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(SA);
  if (sVar3 == sVar2) {
    pcVar4 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&end_local);
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](SA,0);
    iVar1 = sufcheck64(pcVar4,pvVar5,sVar2,1);
    begin_local._M_current._7_1_ = iVar1 == 0;
  }
  else {
    begin_local._M_current._7_1_ = false;
  }
  return begin_local._M_current._7_1_;
}

Assistant:

bool check(InputIterator begin, InputIterator end, const std::vector<T>& SA)
{
    typedef typename std::iterator_traits<InputIterator>::value_type char_t;
    if (sizeof(char_t) != 1)
        throw std::runtime_error("Input must be a char type");
    std::size_t n = std::distance(begin, end);
    if (SA.size() != n)
        return false;
    if (sizeof(T) == sizeof(saidx_t)) {
        if (n >= std::numeric_limits<saidx_t>::max())
            throw std::runtime_error("Input size is too large for 32bit indexing.");
        return sufcheck(reinterpret_cast<const sauchar_t*>(&(*begin)),
                        reinterpret_cast<const saidx_t*>(&SA[0]), n, 1) == 0;
    } else if (sizeof(T) == sizeof(saidx64_t)) {
        return sufcheck64(reinterpret_cast<const sauchar_t*>(&(*begin)),
                          reinterpret_cast<const saidx64_t*>(&SA[0]), n, 1) == 0;
    } else {
        throw std::runtime_error("Unsupported datatype of Suffix Array.");
    }
}